

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

ActionHistoryTree * __thiscall
PlanningUnitMADPDiscrete::CreateActionHistoryTree(PlanningUnitMADPDiscrete *this,Index agentI)

{
  pointer pvVar1;
  ulong uVar2;
  long lVar3;
  PlanningUnitMADPDiscrete *pPVar4;
  int iVar5;
  Index IVar6;
  undefined4 extraout_var;
  ActionHistory *pAVar7;
  TreeNode<ActionHistory> *pTVar8;
  size_type sVar9;
  ostream *poVar10;
  ActionHistoryTree *pAVar11;
  uint uVar12;
  ActionHistoryTree *pAVar13;
  uint local_cc;
  ActionHistoryTree *oht;
  long local_c0;
  PlanningUnitMADPDiscrete *local_b8;
  int local_ac;
  ActionHistoryTree *local_a8;
  ActionHistoryTree *local_a0;
  ActionHistoryTree *next_oht;
  ulong local_90;
  ActionHistoryTree *root;
  queue<TreeNode<ActionHistory>_*,_std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>
  ohtQueue;
  
  uVar2 = (ulong)agentI;
  std::
  queue<TreeNode<ActionHistory>*,std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>>
  ::queue<std::deque<TreeNode<ActionHistory>*,std::allocator<TreeNode<ActionHistory>*>>,void>
            (&ohtQueue);
  local_ac = (int)(this->super_PlanningUnit)._m_horizon;
  iVar5 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,uVar2);
  next_oht = (ActionHistoryTree *)0x0;
  pAVar7 = (ActionHistory *)operator_new(0x30);
  ActionHistory::ActionHistory(pAVar7,this,agentI);
  pTVar8 = (TreeNode<ActionHistory> *)operator_new(0x58);
  TreeNode<ActionHistory>::TreeNode(pTVar8,pAVar7);
  root = pTVar8;
  std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
            (&ohtQueue.c,&root);
  local_c0 = uVar2 * 0x18;
  oht = (ActionHistoryTree *)0x0;
  local_b8 = this;
  local_90 = uVar2;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
  emplace_back<unsigned_long_long>
            ((this->_m_firstAHIforT).
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar2,(unsigned_long_long *)&oht);
  local_ac = local_ac + -1;
  pAVar13 = (ActionHistoryTree *)0x0;
  local_cc = 0;
  while( true ) {
    sVar9 = std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::size
                      (&ohtQueue.c);
    pPVar4 = local_b8;
    lVar3 = local_c0;
    local_a8 = pAVar13;
    if (sVar9 == 0) break;
    oht = *ohtQueue.c.
           super__Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
    oht->_m_index = (LIndex)pAVar13;
    oht->_m_indexValid = true;
    std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
              ((vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *)
               ((long)&(((local_b8->_m_actionHistoryTreeVectors).
                         super__Vector_base<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_c0),&oht);
    uVar12 = (uint)(oht->_m_containedElem->super_IndividualHistory).super_History._m_length;
    if (local_cc != uVar12) {
      IVar6 = Globals::CastLIndexToIndex
                        (*(LIndex *)
                          (*(long *)((long)&(((local_b8->_m_firstAHIforT).
                                              super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start + local_c0) +
                          (ulong)local_cc * 8));
      local_a0 = (ActionHistoryTree *)(ulong)((int)local_a8 - IVar6);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((local_b8->_m_nrActionHistoriesT).
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + local_c0),(unsigned_long *)&local_a0);
      local_cc = local_cc + 1;
      if (local_cc != uVar12) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"ERROR: CreateActionHistories:  ++ts != ");
        poVar10 = std::operator<<(poVar10,"(Index) thisLength !!! ts (now) is: ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        poVar10 = std::operator<<(poVar10,"thisLength  =");
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,uVar12);
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      local_a0 = pAVar13;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      emplace_back<unsigned_long_long>
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 ((long)&(((local_b8->_m_firstAHIforT).
                           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_c0),
                 (unsigned_long_long *)&local_a0);
    }
    if ((int)uVar12 < local_ac) {
      for (uVar12 = 0; (ulong)uVar12 < CONCAT44(extraout_var,iVar5); uVar12 = uVar12 + 1) {
        pAVar7 = (ActionHistory *)operator_new(0x30);
        ActionHistory::ActionHistory(pAVar7,uVar12,oht->_m_containedElem);
        pTVar8 = (TreeNode<ActionHistory> *)operator_new(0x58);
        TreeNode<ActionHistory>::TreeNode(pTVar8,pAVar7);
        next_oht = pTVar8;
        TreeNode<ActionHistory>::SetSuccessor(oht,(ulong)uVar12,pTVar8);
        std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
                  (&ohtQueue.c,&next_oht);
      }
    }
    pAVar13 = (ActionHistoryTree *)(ulong)((int)local_a8 + 1);
    std::deque<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::pop_front
              (&ohtQueue.c);
  }
  IVar6 = Globals::CastLIndexToIndex
                    (*(LIndex *)
                      (*(long *)((long)&(((local_b8->_m_firstAHIforT).
                                          super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + local_c0) +
                      (ulong)local_cc * 8));
  oht = (ActionHistoryTree *)(ulong)((int)local_a8 - IVar6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(((pPVar4->_m_nrActionHistoriesT).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar3),(unsigned_long *)&oht);
  pAVar11 = (ActionHistoryTree *)
            IndexTools::CalculateNumberOfSequences
                      (CONCAT44(extraout_var,iVar5),(pPVar4->super_PlanningUnit)._m_horizon - 1);
  if ((pAVar11 != pAVar13) ||
     (pvVar1 = (pPVar4->_m_actionHistoryTreeVectors).
               super__Vector_base<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ActionHistoryTree *)
     (*(long *)((long)&(pvVar1->
                       super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish + lVar3) -
      *(long *)((long)&(pvVar1->
                       super__Vector_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar3) >> 3) != pAVar13)) {
    poVar10 = std::operator<<((ostream *)&std::cerr," WARNING:ActionHistoryIndex=");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," nrActionHistories=");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," _m_actionHistoryTreeVectors[agentI=");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10,"].size()=");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  oht = pAVar13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&pPVar4->_m_nrActionHistories,(unsigned_long *)&oht);
  pAVar13 = root;
  std::_Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::
  ~_Deque_base((_Deque_base<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *
               )&ohtQueue);
  return pAVar13;
}

Assistant:

ActionHistoryTree* PlanningUnitMADPDiscrete::CreateActionHistoryTree(Index agentI)
{
    //we want to number the Action Histories breadth-first, so we 
    //use a queue:
    queue<ActionHistoryTree*> ohtQueue;
    
    Index ActionHistoryIndex = 0;
    int maxLength = GetHorizon() - 1;//max. action hist length = h - 1
    size_t nrO = GetNrActions(agentI);
    ActionHistory* next_oh = 0;
    ActionHistoryTree* next_oht = 0;
    
    // return a new initial (=empty) action history

    //action history never has an initial action
    //if(!GetMADPDI()->IsInitialActionEmpty())
    //    throw E("this MADP issues a non-empty initial action, but this is not yet supported by PlanningUnitMADPDiscrete::CreateActionHistoryTree");

    ActionHistory* oh = new ActionHistory(*this, agentI);
    ActionHistoryTree* root = new ActionHistoryTree(oh);//, nrO);
    ohtQueue.push(root);
    Index ts = 0;
    _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);
    while(ohtQueue.size() > 0)
    {
        ActionHistoryTree* oht = ohtQueue.front();
        oht->SetIndex(ActionHistoryIndex);
        _m_actionHistoryTreeVectors[agentI].push_back(oht);
        int thisLength = oht->GetContainedElement()->GetLength(); 
        if(ts != (Index) thisLength ) //length 0 <-> ts 0 
        {
            // we've now started processing AHs for the next ts
            Index nr_AHI_for_ts = ActionHistoryIndex - 
                CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
            cout << "First ah for next ts+1: store nr of ts-AH..."<<endl<<
                "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
                _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
                ActionHistoryIndex << endl;
            Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif                
            _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts); 
#if DEBUG_PUDCAHT
            cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<
                tempIndex <<" (ts="<<ts<<")] = "<< nr_AHI_for_ts <<endl;
#endif
            if(++ts != (Index) thisLength)
                cerr << "ERROR: CreateActionHistories:  ++ts != "<<
                    "(Index) thisLength !!! ts (now) is: "<<ts<<
                    "thisLength  =" << thisLength <<endl;            
            _m_firstAHIforT[agentI].push_back(ActionHistoryIndex);            
        }
        
        ActionHistoryIndex++; //index of an Action HISTORY
        
        if(thisLength < maxLength)
            for(Index obsI = 0; obsI < nrO; obsI++) //obsI = action index
            {
                next_oh = new ActionHistory(obsI, 
                    oht->GetActionHistory());
                next_oht = new ActionHistoryTree(next_oh);//, nrO);
                oht->SetSuccessor(obsI, next_oht);
                ohtQueue.push(next_oht);
            }
        ohtQueue.pop();
    }    
    //there is no next time step, so _m_nrObservationHistoriesT[agentI][lastTs]
    //have not been stored yet: do this now
    Index nr_AHI_for_ts = ActionHistoryIndex
        - CastLIndexToIndex(_m_firstAHIforT[agentI][ts]);
#if DEBUG_PUDCAHT
    cout << "Last ts end: store nr of ts=h-1 AH..."<<endl<<
        "_m_firstAHIforT[agentI="<<agentI<<"][ts="<<ts<<"] = "<<
        _m_firstAHIforT[agentI][ts] << ", current AHI = " <<
        ActionHistoryIndex << endl;
    Index tempIndex = _m_nrActionHistoriesT[agentI].size();
#endif
    _m_nrActionHistoriesT[agentI].push_back(nr_AHI_for_ts);
#if DEBUG_PUDCAHT
    cout << "Set  _m_nrActionHistoriesT[agentI="<<agentI<<"][t="<<tempIndex
         <<" (last time step ts="<<ts<<")] = "<< nr_AHI_for_ts<<endl;
#endif

    //in a horizon h MADP without initial observation, the max. action
    //sequence length is h-1 actions (and the minimum is 0).
    //(after h actions the problem is ended already - length-h action sequences
    //are not considered.)
    size_t nrActionHist;
    size_t length = GetHorizon() - 1; // = maxLength 
    nrActionHist = IndexTools::CalculateNumberOfSequences(nrO, length);
    
    if( ActionHistoryIndex != nrActionHist || 
        nrActionHist != _m_actionHistoryTreeVectors[agentI].size() )
        cerr << " WARNING:ActionHistoryIndex="<< ActionHistoryIndex <<
        " nrActionHistories=" << nrActionHist << 
        " _m_actionHistoryTreeVectors[agentI="<<agentI<<"].size()="<<
        _m_actionHistoryTreeVectors[agentI].size() << endl;
    
    _m_nrActionHistories.push_back(ActionHistoryIndex);
    
    return(root);
}